

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O0

void tsgSetConformalTransformASIN(void *grid,int *truncation)

{
  uint uVar1;
  int in_ECX;
  vector<int,_std::allocator<int>_> local_30;
  int *local_18;
  int *truncation_local;
  void *grid_local;
  
  local_18 = truncation;
  truncation_local = (int *)grid;
  uVar1 = TasGrid::TasmanianSparseGrid::getNumDimensions((TasmanianSparseGrid *)grid);
  TasGrid::Utils::copyArray<int_const,int>(&local_30,(Utils *)truncation,(int *)(ulong)uVar1,in_ECX)
  ;
  TasGrid::TasmanianSparseGrid::setConformalTransformASIN((TasmanianSparseGrid *)grid,&local_30);
  std::vector<int,_std::allocator<int>_>::~vector(&local_30);
  return;
}

Assistant:

void tsgSetConformalTransformASIN(void *grid, const int truncation[]){
    ((TasmanianSparseGrid*) grid)->setConformalTransformASIN(Utils::copyArray(truncation, ((TasmanianSparseGrid*) grid)->getNumDimensions()));
}